

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  undefined8 *puVar2;
  Rep *pRVar3;
  ulong uVar4;
  Nonnull<const_char_*> failure_msg;
  ulong uVar5;
  RepeatedPtrFieldBase *pRVar6;
  LogMessageFatal LStack_28;
  
  uVar1 = this->current_size_;
  pRVar6 = this;
  if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = rep(this);
    pRVar6 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  if ((int)uVar1 < 1) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)(int)uVar1,0,"n > 0");
  }
  else {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    uVar4 = 1;
    if (1 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    uVar5 = 0;
    do {
      puVar2 = (undefined8 *)(&pRVar6->tagged_rep_or_elem_)[uVar5];
      uVar5 = uVar5 + 1;
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    } while (uVar4 != uVar5);
    this->current_size_ = 0;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x2ca,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

PROTOBUF_NOINLINE void ClearNonEmpty() {
    const int n = current_size_;
    void* const* elems = elements();
    int i = 0;
    ABSL_DCHECK_GT(n, 0);
    // do/while loop to avoid initial test because we know n > 0
    do {
      TypeHandler::Clear(cast<TypeHandler>(elems[i++]));
    } while (i < n);
    ExchangeCurrentSize(0);
  }